

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

string * __thiscall
QUtil::read_file_into_string_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,char *filename)

{
  FILE *__stream;
  FILE *f;
  char *in_R8;
  string_view filename_00;
  
  __stream = (FILE *)safe_fopen((char *)this,"rb");
  f = (FILE *)strlen((char *)this);
  filename_00._M_str = in_R8;
  filename_00._M_len = (size_t)this;
  read_file_into_string_abi_cxx11_(__return_storage_ptr__,(QUtil *)__stream,f,filename_00);
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::read_file_into_string(char const* filename)
{
    FILE* f = safe_fopen(filename, "rb");
    FileCloser fc(f);
    return read_file_into_string(f, filename);
}